

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuples.h
# Opt level: O3

void __thiscall
chrono::ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>::
ChConstraintTwoTuples
          (ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>
           *this,ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>
                 *other)

{
  double dVar1;
  
  (this->super_ChConstraint).valid = false;
  (this->super_ChConstraint).disabled = false;
  (this->super_ChConstraint).redundant = false;
  (this->super_ChConstraint).broken = false;
  (this->super_ChConstraint).c_i = 0.0;
  (this->super_ChConstraint).l_i = 0.0;
  (this->super_ChConstraint).b_i = 0.0;
  (this->super_ChConstraint).cfm_i = 0.0;
  (this->super_ChConstraint).active = true;
  (this->super_ChConstraint).mode = CONSTRAINT_LOCK;
  (this->super_ChConstraint).g_i = 0.0;
  (this->super_ChConstraint)._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b29488
  ;
  (this->tuple_a).variables = (other->tuple_a).variables;
  dVar1 = (other->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
          .m_data.array[1];
  (this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[0] = (other->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[0];
  (this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[1] = dVar1;
  (this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[2] = (other->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[2];
  dVar1 = (other->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[1];
  (this->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (other->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
  (this->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[1] = dVar1;
  (this->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = (other->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[2];
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>::ChConstraintTuple_3vars
            (&this->tuple_b,&other->tuple_b);
  return;
}

Assistant:

ChConstraintTwoTuples(const ChConstraintTwoTuples& other) : tuple_a(other.tuple_a), tuple_b(other.tuple_b) {}